

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::ColumnArrowToDuckDBDictionary
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               uint64_t parent_offset)

{
  LogicalType *args;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var1;
  ArrowArray *pAVar2;
  void *pvVar3;
  templated_unique_single_t tVar4;
  undefined8 uVar5;
  bool bVar6;
  ArrowArrayPhysicalType AVar7;
  VectorBuffer *pVVar8;
  type pVVar9;
  unsigned_long uVar10;
  ArrowType *type;
  idx_t iVar11;
  long lVar12;
  Vector *other;
  idx_t i;
  data_ptr_t indices_p;
  bool bVar13;
  uint64_t in_stack_ffffffffffffff30;
  templated_unique_single_t base_vector;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  idx_t local_a0;
  ArrowScanLocalState *local_90;
  Vector *local_88;
  LogicalType offset_type;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> local_60;
  SelectionVector sel;
  
  local_88 = vector;
  ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&base_vector,
             (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&vector->buffer);
  tVar4 = base_vector;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
  if (tVar4.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0) {
    ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&base_vector,
               (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&vector->buffer);
    pVVar8 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                       ((shared_ptr<duckdb::VectorBuffer,_true> *)&base_vector);
    make_uniq<duckdb::ArrowAuxiliaryData,duckdb::shared_ptr<duckdb::ArrowArrayWrapper,true>&>
              ((duckdb *)&offset_type,&array_state->owned_data);
    uVar5 = offset_type._0_8_;
    offset_type.id_ = INVALID;
    offset_type.physical_type_ = ~INVALID;
    offset_type._2_6_ = 0;
    _Var1._M_head_impl =
         (pVVar8->aux_data).
         super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
    (pVVar8->aux_data).
    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl =
         (VectorAuxiliaryData *)uVar5;
    if (_Var1._M_head_impl != (VectorAuxiliaryData *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
      if (offset_type._0_8_ != 0) {
        (**(code **)(*(long *)offset_type._0_8_ + 8))();
      }
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
  }
  bVar13 = true;
  if (array->null_count < 1) {
    if (parent_mask == (ValidityMask *)0x0) {
      bVar13 = false;
    }
    else {
      bVar13 = (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
               (unsigned_long *)0x0;
    }
  }
  local_90 = array_state->state;
  bVar6 = ArrowArrayScanState::CacheOutdated(array_state,array->dictionary);
  if (bVar6) {
    args = &local_88->type;
    offset_type._0_8_ =
         NumericCastImpl<unsigned_long,_long,_false>::Convert(array->dictionary->length);
    make_uniq<duckdb::Vector,duckdb::LogicalType_const&,unsigned_long>
              ((duckdb *)&base_vector,args,(unsigned_long *)&offset_type);
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        &base_vector);
    pAVar2 = array->dictionary;
    uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar2->length);
    SetValidityMask(pVVar9,pAVar2,local_90,uVar10,0,0,bVar13);
    type = ArrowType::GetDictionary(arrow_type);
    AVar7 = anon_unknown_2::GetArrowArrayPhysicalType(type);
    if (AVar7 == DICTIONARY_ENCODED) {
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&base_vector);
      pAVar2 = array->dictionary;
      uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar2->length);
      ColumnArrowToDuckDBDictionary(pVVar9,pAVar2,array_state,uVar10,type,-1,(ValidityMask *)0x0,0);
    }
    else if (AVar7 == RUN_END_ENCODED) {
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&base_vector);
      pAVar2 = array->dictionary;
      uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar2->length);
      ColumnArrowToDuckDBRunEndEncoded
                (pVVar9,pAVar2,array_state,uVar10,type,-1,(ValidityMask *)0x0,
                 in_stack_ffffffffffffff30);
    }
    else {
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&base_vector);
      pAVar2 = array->dictionary;
      uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar2->length);
      ColumnArrowToDuckDB(pVVar9,pAVar2,array_state,uVar10,type,-1,(ValidityMask *)0x0,0,false);
    }
    local_60._M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)
         (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)
         base_vector.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    base_vector.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)
         (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0;
    ArrowArrayScanState::AddDictionary
              (array_state,
               (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)&local_60,
               array->dictionary);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr(&local_60);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              (&base_vector.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>);
  }
  ArrowType::GetDuckType(&offset_type,arrow_type,false);
  pvVar3 = array->buffers[1];
  iVar11 = GetTypeIdSize(offset_type.physical_type_);
  lVar12 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  lVar12 = lVar12 + array->offset + local_90->chunk_offset;
  if (nested_offset != -1) {
    lVar12 = array->offset + nested_offset;
  }
  indices_p = (data_ptr_t)((long)pvVar3 + lVar12 * iVar11);
  sel.sel_vector = (sel_t *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (bVar13 == false) {
    SetSelectionVector(&sel,indices_p,&offset_type,size,(ValidityMask *)0x0,0);
  }
  else {
    base_vector.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)
         (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0 = 0x800;
    lVar12 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
    GetValidityMask((ValidityMask *)&base_vector,array,local_90,size,lVar12,-1,false);
    if ((parent_mask != (ValidityMask *)0x0) &&
       ((parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
        (unsigned_long *)0x0)) {
      for (iVar11 = 0; size != iVar11; iVar11 = iVar11 + 1) {
        bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                           (&parent_mask->super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar13) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&base_vector,iVar11);
        }
      }
    }
    uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(array->dictionary->length);
    SetSelectionVector(&sel,indices_p,&offset_type,size,(ValidityMask *)&base_vector,uVar10);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  }
  other = ArrowArrayScanState::GetDictionary(array_state);
  Vector::Slice(local_88,other,&sel,size);
  Vector::Verify(local_88,size);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  LogicalType::~LogicalType(&offset_type);
  return;
}

Assistant:

static void ColumnArrowToDuckDBDictionary(Vector &vector, ArrowArray &array, ArrowArrayScanState &array_state,
                                          idx_t size, const ArrowType &arrow_type, int64_t nested_offset,
                                          const ValidityMask *parent_mask, uint64_t parent_offset) {
	if (vector.GetBuffer()) {
		vector.GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(array_state.owned_data));
	}
	D_ASSERT(arrow_type.HasDictionary());
	auto &scan_state = array_state.state;
	const bool has_nulls = CanContainNull(array, parent_mask);
	if (array_state.CacheOutdated(array.dictionary)) {
		//! We need to set the dictionary data for this column
		auto base_vector = make_uniq<Vector>(vector.GetType(), NumericCast<idx_t>(array.dictionary->length));
		SetValidityMask(*base_vector, *array.dictionary, scan_state, NumericCast<idx_t>(array.dictionary->length), 0, 0,
		                has_nulls);
		auto &dictionary_type = arrow_type.GetDictionary();
		auto arrow_physical_type = GetArrowArrayPhysicalType(dictionary_type);
		switch (arrow_physical_type) {
		case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
			ColumnArrowToDuckDBDictionary(*base_vector, *array.dictionary, array_state,
			                              NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		case ArrowArrayPhysicalType::RUN_END_ENCODED:
			ColumnArrowToDuckDBRunEndEncoded(*base_vector, *array.dictionary, array_state,
			                                 NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		case ArrowArrayPhysicalType::DEFAULT:
			ColumnArrowToDuckDB(*base_vector, *array.dictionary, array_state,
			                    NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		default:
			throw NotImplementedException("ArrowArrayPhysicalType not recognized");
		};
		array_state.AddDictionary(std::move(base_vector), array.dictionary);
	}
	auto offset_type = arrow_type.GetDuckType();
	//! Get Pointer to Indices of Dictionary
	auto indices = ArrowBufferData<data_t>(array, 1) +
	               GetTypeIdSize(offset_type.InternalType()) *
	                   GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset), scan_state, nested_offset);

	SelectionVector sel;
	if (has_nulls) {
		ValidityMask indices_validity;
		GetValidityMask(indices_validity, array, scan_state, size, NumericCast<int64_t>(parent_offset));
		if (parent_mask && !parent_mask->AllValid()) {
			auto &struct_validity_mask = *parent_mask;
			for (idx_t i = 0; i < size; i++) {
				if (!struct_validity_mask.RowIsValid(i)) {
					indices_validity.SetInvalid(i);
				}
			}
		}
		SetSelectionVector(sel, indices, offset_type, size, &indices_validity,
		                   NumericCast<idx_t>(array.dictionary->length));
	} else {
		SetSelectionVector(sel, indices, offset_type, size);
	}
	vector.Slice(array_state.GetDictionary(), sel, size);
	vector.Verify(size);
}